

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binasc.cpp
# Opt level: O2

void checkOptions(Options *opts)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  char *pcVar7;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_88,"a|ascii=b",(allocator *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_60,"Display only printable ASCII characters.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"b|binary|bytes=b",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Display only byte hex codes.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"c|compile=s:",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Compile ASCII file into binary form.",&local_89)
  ;
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"man|manual=b",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Print the manual.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"m|midi=b",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Print binary data as MIDI file.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"mod=i:25",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Number of hex codes on a line.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"wrap=i:75",(allocator *)&local_38);
  std::__cxx11::string::string
            ((string *)&local_60,"Number of characters on line for -a option",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"author=b",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Author of the program.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"version=b",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Version of the program.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"example=b",(allocator *)&local_38);
  std::__cxx11::string::string((string *)&local_60,"Example usage of the program.",&local_89);
  smf::Options::define(opts,&local_88,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"help=b",(allocator *)&local_60);
  smf::Options::define(opts,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  smf::Options::process(opts,1,0);
  std::__cxx11::string::string((string *)&local_88,"a",&local_89);
  bVar2 = smf::Options::getBoolean(opts,&local_88);
  std::__cxx11::string::string((string *)&local_60,"b",&local_61);
  bVar3 = smf::Options::getBoolean(opts,&local_60);
  std::__cxx11::string::string((string *)&local_38,"c",&local_39);
  bVar4 = smf::Options::getBoolean(opts,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  if (1 < (byte)(bVar4 + bVar3 + bVar2)) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Error: only one of the opts -a, -b, or -c can be usedat one time.");
    std::endl<char,std::char_traits<char>>(poVar6);
    smf::Options::getCommand_abi_cxx11_(&local_60,opts);
    std::__cxx11::string::string
              ((string *)&local_88,local_60._M_dataplus._M_p,(allocator *)&local_38);
    usage(&local_88);
LAB_00111235:
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_60);
LAB_00111249:
    exit(1);
  }
  std::__cxx11::string::string((string *)&local_88,"author",(allocator *)&local_60);
  bVar2 = smf::Options::getBoolean(opts,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    pcVar7 = "craig@ccrma.stanford.edu, April 1997";
  }
  else {
    std::__cxx11::string::string((string *)&local_88,"version",(allocator *)&local_60);
    bVar2 = smf::Options::getBoolean(opts,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_88,"help",(allocator *)&local_60);
      bVar2 = smf::Options::getBoolean(opts,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar2) {
        smf::Options::getCommand_abi_cxx11_(&local_60,opts);
        std::__cxx11::string::string
                  ((string *)&local_88,local_60._M_dataplus._M_p,(allocator *)&local_38);
        usage(&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::~string((string *)&local_60);
        goto LAB_001111e7;
      }
      std::__cxx11::string::string((string *)&local_88,"example",(allocator *)&local_60);
      bVar2 = smf::Options::getBoolean(opts,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar2) {
        example();
        goto LAB_001111e7;
      }
      std::__cxx11::string::string((string *)&local_88,"manual",(allocator *)&local_60);
      bVar2 = smf::Options::getBoolean(opts,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (bVar2) {
        manual();
        goto LAB_001111e7;
      }
      std::__cxx11::string::string((string *)&local_88,"compile",&local_89);
      bVar2 = smf::Options::getBoolean(opts,&local_88);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_38,"compile",&local_61);
        smf::Options::getString(&local_60,opts,&local_38);
        cVar1 = *local_60._M_dataplus._M_p;
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_88);
        if (cVar1 == '\0') {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Error: you must specify an output file when using the -c option"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          goto LAB_00111249;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&local_88);
      }
      iVar5 = smf::Options::getArgCount(opts);
      if (0 < iVar5) {
        return;
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "Error: you must specify at least one file on the command-line");
      std::endl<char,std::char_traits<char>>(poVar6);
      smf::Options::getCommand_abi_cxx11_(&local_60,opts);
      std::__cxx11::string::string
                ((string *)&local_88,local_60._M_dataplus._M_p,(allocator *)&local_38);
      usage(&local_88);
      goto LAB_00111235;
    }
    poVar6 = std::operator<<((ostream *)&std::cout,"version: Wed Apr 11 12:39:39 PDT 2018");
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::cout,"compiled:    ");
    pcVar7 = "Apr 27 2025";
  }
  poVar6 = std::operator<<(poVar6,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar6);
LAB_001111e7:
  exit(0);
}

Assistant:

void checkOptions(Options& opts) {
	opts.define("a|ascii=b",       "Display only printable ASCII characters."  );
	opts.define("b|binary|bytes=b","Display only byte hex codes."              );
	opts.define("c|compile=s:",    "Compile ASCII file into binary form."      );
	opts.define("man|manual=b",    "Print the manual."                         );
	opts.define("m|midi=b",        "Print binary data as MIDI file."           );
	opts.define("mod=i:25",        "Number of hex codes on a line."            );
	opts.define("wrap=i:75",       "Number of characters on line for -a option");
	opts.define("author=b",        "Author of the program."                    );
	opts.define("version=b",       "Version of the program."                   );
	opts.define("example=b",       "Example usage of the program."             );
	opts.define("help=b");
	opts.process();

	if (opts.getBoolean("a") + opts.getBoolean("b") +
			opts.getBoolean("c") > 1) {
		cerr << "Error: only one of the opts -a, -b, or -c can be used"
	           "at one time." << endl;
		usage(opts.getCommand().c_str());
		exit(1);
	}

	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, April 1997" << endl;
		exit(0);
	}
	if (opts.getBoolean("version")) {
		cout << "version: Wed Apr 11 12:39:39 PDT 2018" << endl;
		cout << "compiled:    " << __DATE__ << endl;
		exit(0);
	}
	if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	}
	if (opts.getBoolean("example")) {
		example();
		exit(0);
	}
	if (opts.getBoolean("manual")) {
		manual();
		exit(0);
	}

	if (opts.getBoolean("compile") &&
		strlen(opts.getString("compile").c_str()) == 0) {
		cerr << "Error: you must specify an output file when using the -c option"
			  << endl;
		exit(1);
	}

	if (opts.getArgCount() < 1) {
		cerr << "Error: you must specify at least one file on the command-line"
			  << endl;
		usage(opts.getCommand().c_str());
		exit(1);
	}
}